

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::unsetWindowFrameMargins(QGraphicsWidget *this)

{
  uint uVar1;
  long lVar2;
  QGraphicsWidgetPrivate *this_00;
  double left;
  qreal top;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOptionTitleBar bar;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  uVar1 = (this_00->windowFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((((uVar1 & 1) == 0) || ((byte)((byte)uVar1 | 4) == 0xd)) || ((uVar1 >> 0xb & 1) != 0)) {
    setWindowFrameMargins(this,0.0,0.0,0.0,0.0);
  }
  else {
    bar.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    bar._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    bar.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bar.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar(&bar);
    QGraphicsWidgetPrivate::initStyleOptionTitleBar(this_00,&bar);
    pQVar4 = style(this);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x2c,&bar,0);
    left = (double)iVar3;
    top = QGraphicsWidgetPrivate::titleBarHeight(this_00,&bar);
    setWindowFrameMargins(this,left,top,left,left);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(&bar);
  }
  this_00->setWindowFrameMargins = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::unsetWindowFrameMargins()
{
    Q_D(QGraphicsWidget);
    if ((d->windowFlags & Qt::Window) && (d->windowFlags & Qt::WindowType_Mask) != Qt::Popup &&
         (d->windowFlags & Qt::WindowType_Mask) != Qt::ToolTip && !(d->windowFlags & Qt::FramelessWindowHint)) {
        QStyleOptionTitleBar bar;
        d->initStyleOptionTitleBar(&bar);
        QStyle *style = this->style();
        const qreal margin = style->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, &bar);
        qreal titleBarHeight  = d->titleBarHeight(bar);
        setWindowFrameMargins(margin, titleBarHeight, margin, margin);
    } else {
        setWindowFrameMargins(0, 0, 0, 0);
    }
    d->setWindowFrameMargins = false;
}